

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::substring::
     sort<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator first,iterator last,iterator buf,value_type bufsize,
               value_type depth,value_type size,bool lastsuffix,int blocksize)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  iterator last_00;
  iterator middle;
  iterator middle_00;
  iterator middle_01;
  iterator last_01;
  iterator last_02;
  iterator buf_00;
  ulong uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  BitmapArray<long> *pBVar7;
  ulong uVar8;
  long lVar9;
  pos_type pVar10;
  ulong uVar11;
  pos_type pVar12;
  pos_type pVar13;
  long bufsize_00;
  iterator p1;
  iterator p2;
  iterator first_00;
  iterator first_01;
  iterator first_02;
  iterator first_03;
  iterator first_04;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
  stack2;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
  stack1;
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
  local_d8;
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
  local_88;
  
  pBVar7 = first.array_;
  p1.array_ = PA.array_;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
  ::_M_initialize_map(&local_88,0);
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
  ::_M_initialize_map(&local_d8,0);
  uVar8 = (ulong)lastsuffix + first.pos_;
  lVar9 = (long)blocksize;
  if (lVar9 < (long)(last.pos_ - uVar8)) {
    uVar11 = 0;
    pVar13 = uVar8;
    do {
      pVar12 = pVar13 + lVar9;
      last_00.pos_ = pVar12;
      last_00.array_ = pBVar7;
      first_00.pos_ = pVar13;
      first_00.array_ = pBVar7;
      mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
                ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                  *)&local_88,T,PA,first_00,last_00,depth);
      bufsize_00 = last.pos_ - pVar12;
      if (bufsize_00 < bufsize) {
        uVar2 = uVar11 & 1;
        lVar3 = lVar9;
        uVar4 = uVar11;
        while (uVar2 != 0) {
          pVar10 = pVar13 - lVar3;
          middle.pos_ = pVar13;
          middle.array_ = pBVar7;
          last_01.pos_ = pVar13 + lVar3;
          last_01.array_ = pBVar7;
          first_01.pos_ = pVar10;
          first_01.array_ = pBVar7;
          merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)&local_d8,T,PA,first_01,middle,last_01,buf,bufsize,depth);
          lVar3 = lVar3 * 2;
          uVar2 = uVar4 & 2;
          uVar4 = uVar4 >> 1;
          pVar13 = pVar10;
        }
      }
      else {
        uVar2 = uVar11 & 1;
        lVar3 = lVar9;
        uVar4 = uVar11;
        while (uVar2 != 0) {
          pVar10 = pVar13 - lVar3;
          middle_00.pos_ = pVar13;
          middle_00.array_ = pBVar7;
          last_02.pos_ = pVar13 + lVar3;
          last_02.array_ = pBVar7;
          buf_00.pos_ = pVar12;
          buf_00.array_ = pBVar7;
          first_02.pos_ = pVar10;
          first_02.array_ = pBVar7;
          merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)&local_d8,T,PA,first_02,middle_00,last_02,buf_00,bufsize_00,depth);
          lVar3 = lVar3 * 2;
          uVar2 = uVar4 & 2;
          uVar4 = uVar4 >> 1;
          pVar13 = pVar10;
        }
      }
      uVar11 = uVar11 + 1;
      pVar13 = pVar12;
    } while (lVar9 < bufsize_00);
  }
  else {
    uVar11 = 0;
    pVar12 = uVar8;
  }
  first_03.pos_ = pVar12;
  first_03.array_ = pBVar7;
  mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
            ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              *)&local_88,T,PA,first_03,last,depth);
  if (uVar11 != 0) {
    do {
      pVar13 = pVar12;
      if ((uVar11 & 1) != 0) {
        pVar13 = pVar12 - lVar9;
        middle_01.pos_ = pVar12;
        middle_01.array_ = pBVar7;
        first_04.pos_ = pVar13;
        first_04.array_ = pBVar7;
        merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)&local_d8,T,PA,first_04,middle_01,last,buf,bufsize,depth);
      }
      lVar9 = lVar9 * 2;
      bVar1 = 1 < uVar11;
      uVar11 = uVar11 >> 1;
      pVar12 = pVar13;
    } while (bVar1);
  }
  if (lastsuffix) {
    lVar9 = uVar8 - 1;
    iVar5 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,lVar9);
    if (uVar8 < last.pos_) {
      do {
        (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar8);
        if (-1 < extraout_var_00) {
          iVar6 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar8);
          p1.pos_ = CONCAT44(extraout_var,iVar5) + PA.pos_;
          p2.pos_ = CONCAT44(extraout_var_01,iVar6) + PA.pos_;
          p2.array_ = p1.array_;
          iVar6 = compare_last<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth,size);
          uVar11 = uVar8;
          if (iVar6 < 1) break;
        }
        iVar6 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar8);
        (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,uVar8 - 1,CONCAT44(extraout_var_02,iVar6));
        uVar8 = uVar8 + 1;
        uVar11 = last.pos_;
      } while (uVar8 < last.pos_);
      lVar9 = uVar11 - 1;
    }
    (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,lVar9,CONCAT44(extraout_var,iVar5));
  }
  std::
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
  ::~_Deque_base(&local_d8);
  std::
  _Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
  ::~_Deque_base(&local_88);
  return;
}

Assistant:

void sort(const StringIterator_type T, const SAIterator_type PA,
          SAIterator_type first, SAIterator_type last, BufIterator_type buf,
          typename std::iterator_traits<SAIterator_type>::value_type bufsize,
          typename std::iterator_traits<SAIterator_type>::value_type depth,
          typename std::iterator_traits<SAIterator_type>::value_type size,
          bool lastsuffix, int blocksize = 1024) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  std::stack<helper::stackinfo4<SAIterator_type, SAIterator_type, pos_type, int> > stack1;
  std::stack<
      helper::stackinfo4<SAIterator_type, SAIterator_type, SAIterator_type, int> > stack2;

  SAIterator_type a, b;
  SAIterator_type curbuf;
  pos_type i, j, k, curbufsize;

  if (lastsuffix != false) {
    ++first;
  }
  for (a = first, i = 0; blocksize < (last - a); a += blocksize, ++i) {
    mintrosort(stack1, T, PA, a, a + blocksize, depth);
    curbuf = a + blocksize;
    curbufsize = last - (a + blocksize);
    if (bufsize <= curbufsize) {
      for (b = a, k = blocksize, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
        merge(stack2, T, PA, b - k, b, b + k, curbuf, curbufsize, depth);
      }
    } else {
      for (b = a, k = blocksize, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
        merge(stack2, T, PA, b - k, b, b + k, buf, bufsize, depth);
      }
    }
  }
  mintrosort(stack1, T, PA, a, last, depth);
  for (k = blocksize; i != 0; k <<= 1, i >>= 1) {
    if (i & 1) {
      merge(stack2, T, PA, a - k, a, last, buf, bufsize, depth);
      a -= k;
    }
  }

  if (lastsuffix != false) {
    /* Insert last type B* suffix. */
    for (a = first, i = *(first - 1);
        (a < last)
            && ((*a < 0) || (0 < compare_last(T, PA + i, PA + *a, depth, size)));
        ++a) {
      *(a - 1) = *a;
    }
    *(a - 1) = i;
  }
}